

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O2

TypeID NULLCTypeInfo::TypeSubType(int *typeID)

{
  ExternTypeInfo *pEVar1;
  char *pcVar2;
  anon_union_4_2_4d8b2ff0_for_ExternTypeInfo_14 aVar3;
  
  if (linker != 0) {
    pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),*typeID);
    if (pEVar1->subCat - CAT_ARRAY < 2) {
      aVar3 = pEVar1->field_11;
    }
    else {
      pcVar2 = FastVector<char,_false,_false>::operator[]
                         ((FastVector<char,_false,_false> *)(linker + 0x290),pEVar1->offsetToName);
      aVar3.subType = 0;
      nullcThrowError("typeid::subType received type (%s) that neither pointer nor array",pcVar2);
    }
    return (TypeID)aVar3.subType;
  }
  __assert_fail("linker",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/typeinfo.cpp"
                ,199,"TypeID NULLCTypeInfo::TypeSubType(int *)");
}

Assistant:

TypeID TypeSubType(int* typeID)
	{
		assert(linker);
		ExternTypeInfo &type = linker->exTypes[*typeID];
		if(type.subCat != ExternTypeInfo::CAT_ARRAY && type.subCat != ExternTypeInfo::CAT_POINTER)
		{
			nullcThrowError("typeid::subType received type (%s) that neither pointer nor array", &linker->exSymbols[type.offsetToName]);
			return getTypeID(0);
		}
		return getTypeID(type.subType);
	}